

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssbase_type.cpp
# Opt level: O0

void DeleteNode(LinkList *pList,LinkListNode *pNode)

{
  int local_24;
  LinkListNode *pLStack_20;
  int i;
  LinkListNode *pThroughNode;
  LinkListNode *pNode_local;
  LinkList *pList_local;
  
  if (pList->iNodeCount != 0) {
    if (pNode == pList->pHead) {
      pList->pHead = pNode->pNext;
    }
    else {
      pLStack_20 = pList->pHead;
      for (local_24 = 0; local_24 < pList->iNodeCount; local_24 = local_24 + 1) {
        if (pLStack_20->pNext == pNode) {
          if (pList->pTail == pNode) {
            pLStack_20->pNext = (LinkListNode *)0x0;
            pList->pTail = pLStack_20;
          }
          else {
            pLStack_20->pNext = pNode->pNext;
          }
          break;
        }
        pLStack_20 = pLStack_20->pNext;
      }
    }
    pList->iNodeCount = pList->iNodeCount + -1;
    if (pNode->pData != (void *)0x0) {
      free(pNode->pData);
    }
    free(pNode);
  }
  return;
}

Assistant:

void DeleteNode(LinkList* pList, LinkListNode* pNode)
{
	if (pList->iNodeCount == 0)
		return;

	if (pNode == pList->pHead)
	{
		pList->pHead = pNode->pNext;
	}
	else
	{
		LinkListNode* pThroughNode = pList->pHead;
		for (int i = 0; i < pList->iNodeCount; i++)
		{
			if (pThroughNode->pNext == pNode)
			{
				if (pList->pTail == pNode)
				{
					pThroughNode->pNext = NULL;
					pList->pTail = pThroughNode;
				}
				else
				{
					pThroughNode->pNext = pNode->pNext;
				}
				break;
			}
			pThroughNode = pThroughNode->pNext;
		}
	}

	pList->iNodeCount--;
	if (pNode->pData)
		free(pNode->pData);
	free(pNode);
}